

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

void __thiscall
cmCacheManager::WritePropertyEntries
          (cmCacheManager *this,ostream *os,string *entryKey,CacheEntry *e,cmMessenger *messenger)

{
  char *__s;
  cmValue value;
  long lVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string helpstring;
  string key;
  undefined1 local_e8 [32];
  size_type local_c8;
  pointer local_c0;
  string *local_b8;
  cmMessenger *local_b0;
  CacheEntry *local_a8;
  string local_a0;
  string local_80;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  lVar1 = 0;
  local_b8 = entryKey;
  local_b0 = messenger;
  local_a8 = e;
  do {
    __s = *(char **)((long)PersistentProperties + lVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,__s,(allocator<char> *)&local_60);
    value = CacheEntry::GetProperty(local_a8,(string *)local_e8);
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    if (value.Value != (string *)0x0) {
      local_e8._0_8_ = strlen(__s);
      local_e8._16_8_ = 0x18;
      local_e8._24_8_ = " property for variable: ";
      local_c0 = (entryKey->_M_dataplus)._M_p;
      local_c8 = entryKey->_M_string_length;
      views._M_len = 3;
      views._M_array = (iterator)local_e8;
      local_e8._8_8_ = __s;
      cmCatViews_abi_cxx11_(&local_a0,views);
      OutputHelpString(os,&local_a0);
      local_e8._8_8_ = (entryKey->_M_dataplus)._M_p;
      local_e8._0_8_ = entryKey->_M_string_length;
      local_60 = 1;
      local_e8._24_8_ = local_50;
      local_50[0] = 0x2d;
      local_e8._16_8_ = 1;
      local_58 = (undefined1 *)local_e8._24_8_;
      local_c8 = strlen(__s);
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_e8;
      local_c0 = __s;
      cmCatViews_abi_cxx11_(&local_80,views_00);
      OutputKey(os,&local_80);
      std::__ostream_insert<char,std::char_traits<char>>(os,":INTERNAL=",10);
      OutputValue(os,value.Value);
      local_e8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_e8,1);
      OutputNewlineTruncationWarning(os,&local_80,value.Value,local_b0);
      entryKey = local_b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
    }
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  return;
}

Assistant:

void cmCacheManager::WritePropertyEntries(std::ostream& os,
                                          const std::string& entryKey,
                                          const CacheEntry& e,
                                          cmMessenger* messenger) const
{
  for (const char* p : cmCacheManager::PersistentProperties) {
    if (cmValue value = e.GetProperty(p)) {
      std::string helpstring =
        cmStrCat(p, " property for variable: ", entryKey);
      cmCacheManager::OutputHelpString(os, helpstring);

      std::string key = cmStrCat(entryKey, '-', p);
      cmCacheManager::OutputKey(os, key);
      os << ":INTERNAL=";
      cmCacheManager::OutputValue(os, *value);
      os << '\n';
      cmCacheManager::OutputNewlineTruncationWarning(os, key, *value,
                                                     messenger);
    }
  }
}